

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O0

void Unit_cmp(void)

{
  unit *puVar1;
  unit *puVar2;
  char *pcVar3;
  unit *unaff_retaddr;
  int i;
  unit *up;
  char *in_stack_ffffffffffffffe8;
  FILE *__stream;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  puVar1 = usp;
  if (UnitsOn != 0) {
    if (usp < (unit *)((long)&unit_stack[0].factor + 1)) {
      __assert_fail("usp > unit_stack",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/units.c"
                    ,0x177,"void Unit_cmp()");
    }
    puVar2 = usp + -1;
    if (usp->isnum == 0) {
      if (usp[-1].isnum != 0) {
        for (iVar4 = 0; iVar4 < 10; iVar4 = iVar4 + 1) {
          puVar1->dim[(long)iVar4 + -0x18] = usp->dim[iVar4];
        }
        puVar2->factor = usp->factor;
        puVar1[-1].isnum = 0;
      }
      if (((unitonflag != 0) && (puVar1[-1].dim[0] != '\t')) && (usp->dim[0] != '\t')) {
        for (iVar4 = 0; iVar4 < 10; iVar4 = iVar4 + 1) {
          if (puVar1->dim[(long)iVar4 + -0x18] != usp->dim[iVar4]) {
            chkfperror();
            print_unit_expr(2);
            fprintf(_stderr,"\nunits:");
            units((unit *)0x121d3c);
            print_unit_expr(1);
            fprintf(_stderr,"\nunits:");
            units((unit *)0x121d68);
            diag((char *)CONCAT44(iVar4,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
          }
        }
        if (1e-05 < ABS(usp->factor / puVar2->factor - 1.0)) {
          chkfperror();
          __stream = _stderr;
          pcVar3 = Unit_str(unaff_retaddr);
          fprintf(__stream,
                  "The previous primary expression with units: %s\nis missing a conversion factor and should read:\n  (%g)*("
                  ,usp->factor / puVar2->factor,pcVar3);
          print_unit_expr(2);
          diag((char *)CONCAT44(iVar4,in_stack_fffffffffffffff0),(char *)__stream);
        }
      }
      unit_pop();
    }
    else {
      unit_pop();
    }
  }
  return;
}

Assistant:

void Unit_cmp() {
	/*compares top two units on stack. If not conformable then
	gives error. If not same factor then gives error.
	*/
	struct unit *up;
	int i;
	
	IFUNITS
	assert(usp > unit_stack);
	up = usp - 1;
	if (usp->isnum) {
		unit_pop();
		return;
	}
	if (up->isnum) {
		for (i=0; i < NDIM; i++) {
			up->dim[i] = usp->dim[i];
		}
		up->factor = usp->factor;
		up->isnum = 0;
	}
if (unitonflag && up->dim[0] != 9 && usp->dim[0] != 9) {
	for (i=0; i<NDIM; i++) {
		if (up->dim[i] != usp->dim[i]) {
			chkfperror();
			print_unit_expr(2);
			fprintf(stderr, "\nunits:");
			units(usp);
			print_unit_expr(1);
			fprintf(stderr, "\nunits:");
			units(up);
diag("The units of the previous two expressions are not conformable","\n");
		}
	}
	if (OUTTOLERANCE(up->factor, usp->factor)) {
		chkfperror();
fprintf(stderr, "The previous primary expression with units: %s\n\
is missing a conversion factor and should read:\n  (%g)*(",
Unit_str(usp), usp->factor/up->factor);
		print_unit_expr(2);
		diag(")\n", (char *)0);
	}
}
	unit_pop();
	return;
}